

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image-write.h
# Opt level: O1

void stbiw__jpg_writeBits(stbi__write_context *s,int *bitBufP,int *bitCntP,unsigned_short *bs)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined1 local_3a;
  undefined1 local_39;
  int *local_38;
  
  iVar2 = (uint)bs[1] + *bitCntP;
  uVar4 = (uint)*bs << (0x18U - (char)iVar2 & 0x1f) | *bitBufP;
  local_38 = bitCntP;
  if (7 < iVar2) {
    iVar3 = iVar2;
    do {
      local_3a = (undefined1)(uVar4 >> 0x10);
      (*s->func)(s->context,&local_3a,1);
      if ((~uVar4 & 0xff0000) == 0) {
        local_39 = 0;
        (*s->func)(s->context,&local_39,1);
      }
      uVar4 = uVar4 << 8;
      iVar2 = iVar3 + -8;
      bVar1 = 0xf < iVar3;
      iVar3 = iVar2;
    } while (bVar1);
  }
  *bitBufP = uVar4;
  *local_38 = iVar2;
  return;
}

Assistant:

static void stbiw__jpg_writeBits(stbi__write_context *s, int *bitBufP, int *bitCntP, const unsigned short *bs) {
   int bitBuf = *bitBufP, bitCnt = *bitCntP;
   bitCnt += bs[1];
   bitBuf |= bs[0] << (24 - bitCnt);
   while(bitCnt >= 8) {
      unsigned char c = (bitBuf >> 16) & 255;
      stbiw__putc(s, c);
      if(c == 255) {
         stbiw__putc(s, 0);
      }
      bitBuf <<= 8;
      bitCnt -= 8;
   }
   *bitBufP = bitBuf;
   *bitCntP = bitCnt;
}